

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_util_test.cc
# Opt level: O0

void __thiscall
google::protobuf::util::anon_unknown_0::TimeUtilTest_DurationOperators_Test::TestBody
          (TimeUtilTest_DurationOperators_Test *this)

{
  Duration *d1;
  bool bVar1;
  char *pcVar2;
  Duration *duration;
  Duration *duration_00;
  Duration *duration_01;
  Duration *duration_02;
  Duration *duration_03;
  Duration *duration_04;
  Duration *duration_05;
  Duration *duration_06;
  Duration *duration_07;
  Duration *duration_08;
  Duration *duration_09;
  Duration *duration_10;
  Duration *duration_11;
  Duration *duration_12;
  Duration *duration_13;
  Duration *duration_14;
  Duration *duration_15;
  Duration *duration_16;
  Duration *duration_17;
  Duration *duration_18;
  char *in_R9;
  string local_19d0;
  AssertHelper local_19b0;
  Message local_19a8;
  bool local_1999;
  undefined1 local_1998 [8];
  AssertionResult gtest_ar__20;
  AssertHelper local_1968;
  Message local_1960;
  bool local_1951;
  undefined1 local_1950 [8];
  AssertionResult gtest_ar__19;
  AssertHelper local_1920;
  Message local_1918;
  bool local_1909;
  undefined1 local_1908 [8];
  AssertionResult gtest_ar__18;
  AssertHelper local_18d8;
  Message local_18d0;
  bool local_18c1;
  undefined1 local_18c0 [8];
  AssertionResult gtest_ar__17;
  AssertHelper local_1890;
  Message local_1888;
  bool local_1879;
  undefined1 local_1878 [8];
  AssertionResult gtest_ar__16;
  AssertHelper local_1848;
  Message local_1840;
  bool local_1831;
  undefined1 local_1830 [8];
  AssertionResult gtest_ar__15;
  AssertHelper local_1800;
  Message local_17f8;
  bool local_17e9;
  undefined1 local_17e8 [8];
  AssertionResult gtest_ar__14;
  AssertHelper local_17b8;
  Message local_17b0;
  bool local_17a1;
  undefined1 local_17a0 [8];
  AssertionResult gtest_ar__13;
  AssertHelper local_1770;
  Message local_1768;
  bool local_1759;
  undefined1 local_1758 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_1728;
  Message local_1720;
  bool local_1711;
  undefined1 local_1710 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_16e0;
  Message local_16d8;
  bool local_16c9;
  undefined1 local_16c8 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_1698;
  Message local_1690;
  bool local_1681;
  undefined1 local_1680 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_1650;
  Message local_1648;
  bool local_1639;
  undefined1 local_1638 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_1608;
  Message local_1600;
  Duration local_15f8;
  bool local_15c9;
  undefined1 local_15c8 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_1598;
  Message local_1590;
  Duration local_1588;
  bool local_1559;
  undefined1 local_1558 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_1528;
  Message local_1520;
  Duration local_1518;
  Duration local_14f0;
  bool local_14c1;
  undefined1 local_14c0 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_1490;
  Message local_1488;
  Duration local_1480;
  Duration local_1458;
  bool local_1429;
  undefined1 local_1428 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_13f8;
  Message local_13f0;
  Duration local_13e8;
  Duration local_13c0;
  bool local_1391;
  undefined1 local_1390 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_1360;
  Message local_1358;
  bool local_1349;
  undefined1 local_1348 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_1318;
  Message local_1310;
  bool local_1301;
  undefined1 local_1300 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_12d0;
  Message local_12c8;
  bool local_12b9;
  undefined1 local_12b8 [8];
  AssertionResult gtest_ar_;
  Message local_12a0;
  Duration local_1298;
  Duration local_1270;
  Duration local_1248;
  undefined1 local_1220 [8];
  AssertionResult gtest_ar_35;
  Message local_1208;
  Duration local_1200;
  int64_t local_11d8;
  int local_11cc;
  undefined1 local_11c8 [8];
  AssertionResult gtest_ar_34;
  Message local_11b0;
  Duration local_11a8;
  Duration local_1180;
  undefined1 local_1158 [8];
  AssertionResult gtest_ar_33;
  Message local_1140;
  int64_t local_1138;
  int local_112c;
  undefined1 local_1128 [8];
  AssertionResult gtest_ar_32;
  AssertHelper local_10f0;
  Message local_10e8;
  Duration local_10e0;
  Duration local_10b8;
  Duration local_1090;
  undefined1 local_1068 [8];
  AssertionResult gtest_ar_31;
  Message local_1050;
  Duration local_1048;
  Duration local_1020;
  Duration local_ff8;
  undefined1 local_fd0 [8];
  AssertionResult gtest_ar_30;
  AssertHelper local_f98;
  Message local_f90;
  Duration local_f88;
  Duration local_f60;
  undefined1 local_f38 [8];
  AssertionResult gtest_ar_29;
  Message local_f20;
  Duration local_f18;
  Duration local_ef0;
  Duration local_ec8;
  undefined1 local_ea0 [8];
  AssertionResult gtest_ar_28;
  Message local_e88;
  Duration local_e80;
  undefined1 local_e58 [8];
  AssertionResult gtest_ar_27;
  Message local_e40;
  Duration local_e38;
  Duration local_e10;
  undefined1 local_de8 [8];
  AssertionResult gtest_ar_26;
  Message local_dd0;
  Duration local_dc8;
  Duration local_da0;
  Duration local_d78;
  undefined1 local_d50 [8];
  AssertionResult gtest_ar_25;
  Message local_d38;
  Duration local_d30;
  undefined1 local_d08 [8];
  AssertionResult gtest_ar_24;
  Duration large2;
  Message local_cc8;
  Duration local_cc0;
  Duration local_c98;
  string local_c70;
  undefined1 local_c50 [8];
  AssertionResult gtest_ar_23;
  Message local_c38;
  Duration local_c30;
  Duration local_c08;
  string local_be0;
  undefined1 local_bc0 [8];
  AssertionResult gtest_ar_22;
  Message local_ba8;
  Duration local_ba0;
  Duration local_b78;
  string local_b50;
  undefined1 local_b30 [8];
  AssertionResult gtest_ar_21;
  undefined1 local_af8 [8];
  Duration large;
  Message local_ac8;
  Duration local_ac0;
  Duration local_a98;
  string local_a70;
  undefined1 local_a50 [8];
  AssertionResult gtest_ar_20;
  Message local_a38;
  Duration local_a30;
  Duration local_a08;
  string local_9e0;
  undefined1 local_9c0 [8];
  AssertionResult gtest_ar_19;
  Message local_9a8;
  Duration local_9a0;
  Duration local_978;
  string local_950;
  undefined1 local_930 [8];
  AssertionResult gtest_ar_18;
  Message local_918;
  Duration local_910;
  Duration local_8e8;
  string local_8c0;
  undefined1 local_8a0 [8];
  AssertionResult gtest_ar_17;
  Message local_888;
  Duration local_880;
  Duration local_858;
  string local_830;
  undefined1 local_810 [8];
  AssertionResult gtest_ar_16;
  Message local_7f8;
  Duration local_7f0;
  Duration local_7c8;
  string local_7a0;
  undefined1 local_780 [8];
  AssertionResult gtest_ar_15;
  Message local_768;
  Duration local_760;
  Duration local_738;
  string local_710;
  undefined1 local_6f0 [8];
  AssertionResult gtest_ar_14;
  Message local_6d8;
  Duration local_6d0;
  Duration local_6a8;
  Duration local_680;
  undefined1 local_658 [8];
  AssertionResult gtest_ar_13;
  Message local_640;
  Duration local_638;
  Duration local_610;
  Duration local_5e8;
  undefined1 local_5c0 [8];
  AssertionResult gtest_ar_12;
  Message local_5a8;
  Duration local_5a0;
  Duration local_578;
  Duration local_550;
  undefined1 local_528 [8];
  AssertionResult gtest_ar_11;
  Message local_510;
  Duration local_508;
  Duration local_4e0;
  Duration local_4b8;
  undefined1 local_490 [8];
  AssertionResult gtest_ar_10;
  Message local_478;
  Duration local_470;
  string local_448;
  undefined1 local_428 [8];
  AssertionResult gtest_ar_9;
  Message local_410;
  Duration local_408;
  string local_3e0;
  undefined1 local_3c0 [8];
  AssertionResult gtest_ar_8;
  Message local_3a8;
  Duration local_3a0;
  string local_378;
  undefined1 local_358 [8];
  AssertionResult gtest_ar_7;
  Message local_340;
  Duration local_338;
  string local_310;
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar_6;
  Message local_2d8;
  Duration local_2d0;
  string local_2a8;
  undefined1 local_288 [8];
  AssertionResult gtest_ar_5;
  Message local_270;
  Duration local_268;
  string local_240;
  undefined1 local_220 [8];
  AssertionResult gtest_ar_4;
  Message local_208;
  Duration local_200;
  string local_1d8;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar_3;
  Message local_1a0;
  Duration local_198;
  string local_170;
  undefined1 local_150 [8];
  AssertionResult gtest_ar_2;
  Message local_138;
  string local_130;
  undefined1 local_110 [8];
  AssertionResult gtest_ar_1;
  Duration b;
  Message local_d0;
  string local_c8;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar;
  Duration a;
  undefined1 local_60 [8];
  Duration one_nano;
  Duration one_second;
  TimeUtilTest_DurationOperators_Test *this_local;
  
  TimeUtil::SecondsToDuration((Duration *)((long)&one_nano.field_0 + 0x10),1);
  TimeUtil::NanosecondsToDuration((Duration *)local_60,1);
  Duration::Duration((Duration *)&gtest_ar.message_,(Duration *)((long)&one_nano.field_0 + 0x10));
  protobuf::operator+=((Duration *)&gtest_ar.message_,(Duration *)((long)&one_nano.field_0 + 0x10));
  operator-=((Duration *)&gtest_ar.message_,(Duration *)local_60);
  TimeUtil::ToString_abi_cxx11_(&local_c8,(TimeUtil *)&gtest_ar.message_,duration);
  testing::internal::EqHelper::
  Compare<char[13],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_a8,"\"1.999999999s\"","TimeUtil::ToString(a)",
             (char (*) [13])0x1ed14a7,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&b.field_0 + 0x10),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0xfa,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)((long)&b.field_0 + 0x10),&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&b.field_0 + 0x10));
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  protobuf::operator-((Duration *)&gtest_ar_1.message_,(Duration *)&gtest_ar.message_);
  TimeUtil::ToString_abi_cxx11_(&local_130,(TimeUtil *)&gtest_ar_1.message_,duration_00);
  testing::internal::EqHelper::
  Compare<char[14],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_110,"\"-1.999999999s\"","TimeUtil::ToString(b)",
             (char (*) [14])"-1.999999999s",&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_110);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0xfc,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  protobuf::operator+(&local_198,(Duration *)&gtest_ar.message_,(Duration *)&gtest_ar.message_);
  TimeUtil::ToString_abi_cxx11_(&local_170,(TimeUtil *)&local_198,duration_01);
  testing::internal::EqHelper::
  Compare<char[13],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_150,"\"3.999999998s\"","TimeUtil::ToString(a + a)",
             (char (*) [13])0x1ed1541,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  Duration::~Duration(&local_198);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar1) {
    testing::Message::Message(&local_1a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0xfd,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_1a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_1a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  protobuf::operator+(&local_200,(Duration *)&gtest_ar.message_,(Duration *)&gtest_ar_1.message_);
  TimeUtil::ToString_abi_cxx11_(&local_1d8,(TimeUtil *)&local_200,duration_02);
  testing::internal::EqHelper::
  Compare<char[3],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_1b8,"\"0s\"","TimeUtil::ToString(a + b)",(char (*) [3])0x1ed0967,
             &local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  Duration::~Duration(&local_200);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
  if (!bVar1) {
    testing::Message::Message(&local_208);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0xfe,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_208);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
  protobuf::operator+(&local_268,(Duration *)&gtest_ar_1.message_,(Duration *)&gtest_ar.message_);
  TimeUtil::ToString_abi_cxx11_(&local_240,(TimeUtil *)&local_268,duration_03);
  testing::internal::EqHelper::
  Compare<char[3],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_220,"\"0s\"","TimeUtil::ToString(b + a)",(char (*) [3])0x1ed0967,
             &local_240);
  std::__cxx11::string::~string((string *)&local_240);
  Duration::~Duration(&local_268);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
  if (!bVar1) {
    testing::Message::Message(&local_270);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_220);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0xff,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_270);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_270);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
  protobuf::operator+(&local_2d0,(Duration *)&gtest_ar_1.message_,(Duration *)&gtest_ar_1.message_);
  TimeUtil::ToString_abi_cxx11_(&local_2a8,(TimeUtil *)&local_2d0,duration_04);
  testing::internal::EqHelper::
  Compare<char[14],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_288,"\"-3.999999998s\"","TimeUtil::ToString(b + b)",
             (char (*) [14])"-3.999999998s",&local_2a8);
  std::__cxx11::string::~string((string *)&local_2a8);
  Duration::~Duration(&local_2d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
  if (!bVar1) {
    testing::Message::Message(&local_2d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_288);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x100,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_2d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_2d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
  protobuf::operator-(&local_338,(Duration *)&gtest_ar.message_,(Duration *)&gtest_ar_1.message_);
  TimeUtil::ToString_abi_cxx11_(&local_310,(TimeUtil *)&local_338,duration_05);
  testing::internal::EqHelper::
  Compare<char[13],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_2f0,"\"3.999999998s\"","TimeUtil::ToString(a - b)",
             (char (*) [13])0x1ed1541,&local_310);
  std::__cxx11::string::~string((string *)&local_310);
  Duration::~Duration(&local_338);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f0);
  if (!bVar1) {
    testing::Message::Message(&local_340);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x101,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_340);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_340);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
  protobuf::operator-(&local_3a0,(Duration *)&gtest_ar.message_,(Duration *)&gtest_ar.message_);
  TimeUtil::ToString_abi_cxx11_(&local_378,(TimeUtil *)&local_3a0,duration_06);
  testing::internal::EqHelper::
  Compare<char[3],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_358,"\"0s\"","TimeUtil::ToString(a - a)",(char (*) [3])0x1ed0967,
             &local_378);
  std::__cxx11::string::~string((string *)&local_378);
  Duration::~Duration(&local_3a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_358);
  if (!bVar1) {
    testing::Message::Message(&local_3a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_358);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x102,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_3a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_3a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_358);
  protobuf::operator-(&local_408,(Duration *)&gtest_ar_1.message_,(Duration *)&gtest_ar_1.message_);
  TimeUtil::ToString_abi_cxx11_(&local_3e0,(TimeUtil *)&local_408,duration_07);
  testing::internal::EqHelper::
  Compare<char[3],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_3c0,"\"0s\"","TimeUtil::ToString(b - b)",(char (*) [3])0x1ed0967,
             &local_3e0);
  std::__cxx11::string::~string((string *)&local_3e0);
  Duration::~Duration(&local_408);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c0);
  if (!bVar1) {
    testing::Message::Message(&local_410);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x103,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_410);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_410);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c0);
  protobuf::operator-(&local_470,(Duration *)&gtest_ar_1.message_,(Duration *)&gtest_ar.message_);
  TimeUtil::ToString_abi_cxx11_(&local_448,(TimeUtil *)&local_470,duration_08);
  testing::internal::EqHelper::
  Compare<char[14],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_428,"\"-3.999999998s\"","TimeUtil::ToString(b - a)",
             (char (*) [14])"-3.999999998s",&local_448);
  std::__cxx11::string::~string((string *)&local_448);
  Duration::~Duration(&local_470);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_428);
  if (!bVar1) {
    testing::Message::Message(&local_478);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_428);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x104,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_478);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_478);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_428);
  protobuf::operator+(&local_4b8,(Duration *)&gtest_ar.message_,(Duration *)&gtest_ar.message_);
  Duration::Duration(&local_508,(Duration *)&gtest_ar.message_);
  protobuf::operator*(&local_4e0,&local_508,2);
  testing::internal::EqHelper::
  Compare<google::protobuf::Duration,_google::protobuf::Duration,_nullptr>
            ((EqHelper *)local_490,"a + a","a * 2",&local_4b8,&local_4e0);
  Duration::~Duration(&local_4e0);
  Duration::~Duration(&local_508);
  Duration::~Duration(&local_4b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_490);
  if (!bVar1) {
    testing::Message::Message(&local_510);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_490);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x107,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_510);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_510);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_490);
  protobuf::operator+(&local_550,(Duration *)&gtest_ar_1.message_,(Duration *)&gtest_ar_1.message_);
  Duration::Duration(&local_5a0,(Duration *)&gtest_ar.message_);
  protobuf::operator*(&local_578,&local_5a0,-2);
  testing::internal::EqHelper::
  Compare<google::protobuf::Duration,_google::protobuf::Duration,_nullptr>
            ((EqHelper *)local_528,"b + b","a * (-2)",&local_550,&local_578);
  Duration::~Duration(&local_578);
  Duration::~Duration(&local_5a0);
  Duration::~Duration(&local_550);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_528);
  if (!bVar1) {
    testing::Message::Message(&local_5a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_528);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x108,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_5a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_5a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_528);
  protobuf::operator+(&local_5e8,(Duration *)&gtest_ar_1.message_,(Duration *)&gtest_ar_1.message_);
  Duration::Duration(&local_638,(Duration *)&gtest_ar_1.message_);
  protobuf::operator*(&local_610,&local_638,2);
  testing::internal::EqHelper::
  Compare<google::protobuf::Duration,_google::protobuf::Duration,_nullptr>
            ((EqHelper *)local_5c0,"b + b","b * 2",&local_5e8,&local_610);
  Duration::~Duration(&local_610);
  Duration::~Duration(&local_638);
  Duration::~Duration(&local_5e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5c0);
  if (!bVar1) {
    testing::Message::Message(&local_640);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x109,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_640);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_640);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5c0);
  protobuf::operator+(&local_680,(Duration *)&gtest_ar.message_,(Duration *)&gtest_ar.message_);
  Duration::Duration(&local_6d0,(Duration *)&gtest_ar_1.message_);
  protobuf::operator*(&local_6a8,&local_6d0,-2);
  testing::internal::EqHelper::
  Compare<google::protobuf::Duration,_google::protobuf::Duration,_nullptr>
            ((EqHelper *)local_658,"a + a","b * (-2)",&local_680,&local_6a8);
  Duration::~Duration(&local_6a8);
  Duration::~Duration(&local_6d0);
  Duration::~Duration(&local_680);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_658);
  if (!bVar1) {
    testing::Message::Message(&local_6d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_658);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x10a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_6d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_6d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_658);
  Duration::Duration(&local_760,(Duration *)&gtest_ar.message_);
  protobuf::operator*(&local_738,&local_760,0.5);
  TimeUtil::ToString_abi_cxx11_(&local_710,(TimeUtil *)&local_738,duration_09);
  testing::internal::EqHelper::
  Compare<char[13],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_6f0,"\"0.999999999s\"","TimeUtil::ToString(a * 0.5)",
             (char (*) [13])0x1ed1638,&local_710);
  std::__cxx11::string::~string((string *)&local_710);
  Duration::~Duration(&local_738);
  Duration::~Duration(&local_760);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6f0);
  if (!bVar1) {
    testing::Message::Message(&local_768);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x10b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_768);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_768);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6f0);
  Duration::Duration(&local_7f0,(Duration *)&gtest_ar_1.message_);
  protobuf::operator*(&local_7c8,&local_7f0,0.5);
  TimeUtil::ToString_abi_cxx11_(&local_7a0,(TimeUtil *)&local_7c8,duration_10);
  testing::internal::EqHelper::
  Compare<char[14],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_780,"\"-0.999999999s\"","TimeUtil::ToString(b * 0.5)",
             (char (*) [14])"-0.999999999s",&local_7a0);
  std::__cxx11::string::~string((string *)&local_7a0);
  Duration::~Duration(&local_7c8);
  Duration::~Duration(&local_7f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_780);
  if (!bVar1) {
    testing::Message::Message(&local_7f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_780);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x10c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_7f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_7f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_780);
  protobuf::operator-(&local_880,(Duration *)((long)&one_nano.field_0 + 0x10),(Duration *)local_60);
  protobuf::operator*(&local_858,&local_880,0x4979cb9e00);
  TimeUtil::ToString_abi_cxx11_(&local_830,(TimeUtil *)&local_858,duration_11);
  testing::internal::EqHelper::
  Compare<char[18],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_810,"\"315575999684.424s\"",
             "TimeUtil::ToString((one_second - one_nano) * int64_t{315576000000})",
             (char (*) [18])0x1ed16f7,&local_830);
  std::__cxx11::string::~string((string *)&local_830);
  Duration::~Duration(&local_858);
  Duration::~Duration(&local_880);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_810);
  if (!bVar1) {
    testing::Message::Message(&local_888);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_810);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x110,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_888);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_888);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_810);
  protobuf::operator-(&local_910,(Duration *)local_60,(Duration *)((long)&one_nano.field_0 + 0x10));
  protobuf::operator*(&local_8e8,&local_910,0x4979cb9e00);
  TimeUtil::ToString_abi_cxx11_(&local_8c0,(TimeUtil *)&local_8e8,duration_12);
  testing::internal::EqHelper::
  Compare<char[19],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_8a0,"\"-315575999684.424s\"",
             "TimeUtil::ToString((one_nano - one_second) * int64_t{315576000000})",
             (char (*) [19])"-315575999684.424s",&local_8c0);
  std::__cxx11::string::~string((string *)&local_8c0);
  Duration::~Duration(&local_8e8);
  Duration::~Duration(&local_910);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8a0);
  if (!bVar1) {
    testing::Message::Message(&local_918);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_8a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x112,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,&local_918);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
    testing::Message::~Message(&local_918);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8a0);
  protobuf::operator-(&local_9a0,(Duration *)((long)&one_nano.field_0 + 0x10),(Duration *)local_60);
  protobuf::operator*(&local_978,&local_9a0,-0x4979cb9e00);
  TimeUtil::ToString_abi_cxx11_(&local_950,(TimeUtil *)&local_978,duration_13);
  testing::internal::EqHelper::
  Compare<char[19],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_930,"\"-315575999684.424s\"",
             "TimeUtil::ToString((one_second - one_nano) * (int64_t{-315576000000}))",
             (char (*) [19])"-315575999684.424s",&local_950);
  std::__cxx11::string::~string((string *)&local_950);
  Duration::~Duration(&local_978);
  Duration::~Duration(&local_9a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_930);
  if (!bVar1) {
    testing::Message::Message(&local_9a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_930);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x114,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_9a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(&local_9a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_930);
  Duration::Duration(&local_a30,(Duration *)&gtest_ar.message_);
  operator/(&local_a08,&local_a30,2);
  TimeUtil::ToString_abi_cxx11_(&local_9e0,(TimeUtil *)&local_a08,duration_14);
  testing::internal::EqHelper::
  Compare<char[13],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_9c0,"\"0.999999999s\"","TimeUtil::ToString(a / 2)",
             (char (*) [13])0x1ed1638,&local_9e0);
  std::__cxx11::string::~string((string *)&local_9e0);
  Duration::~Duration(&local_a08);
  Duration::~Duration(&local_a30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9c0);
  if (!bVar1) {
    testing::Message::Message(&local_a38);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_9c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x117,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,&local_a38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
    testing::Message::~Message(&local_a38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9c0);
  Duration::Duration(&local_ac0,(Duration *)&gtest_ar_1.message_);
  operator/(&local_a98,&local_ac0,2);
  TimeUtil::ToString_abi_cxx11_(&local_a70,(TimeUtil *)&local_a98,duration_15);
  testing::internal::EqHelper::
  Compare<char[14],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_a50,"\"-0.999999999s\"","TimeUtil::ToString(b / 2)",
             (char (*) [14])"-0.999999999s",&local_a70);
  std::__cxx11::string::~string((string *)&local_a70);
  Duration::~Duration(&local_a98);
  Duration::~Duration(&local_ac0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a50);
  if (!bVar1) {
    testing::Message::Message(&local_ac8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a50);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&large.field_0 + 0x10),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x118,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&large.field_0 + 0x10),&local_ac8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&large.field_0 + 0x10));
    testing::Message::~Message(&local_ac8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a50);
  TimeUtil::SecondsToDuration((Duration *)&gtest_ar_21.message_,0x4979cb9e00);
  protobuf::operator-((Duration *)local_af8,(Duration *)&gtest_ar_21.message_,(Duration *)local_60);
  Duration::~Duration((Duration *)&gtest_ar_21.message_);
  Duration::Duration(&local_ba0,(Duration *)local_af8);
  operator/(&local_b78,&local_ba0,0x4979cb9e00);
  TimeUtil::ToString_abi_cxx11_(&local_b50,(TimeUtil *)&local_b78,duration_16);
  testing::internal::EqHelper::
  Compare<char[13],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_b30,"\"0.999999999s\"",
             "TimeUtil::ToString(large / int64_t{315576000000})",(char (*) [13])0x1ed1638,&local_b50
            );
  std::__cxx11::string::~string((string *)&local_b50);
  Duration::~Duration(&local_b78);
  Duration::~Duration(&local_ba0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b30);
  if (!bVar1) {
    testing::Message::Message(&local_ba8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b30);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x11c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22.message_,&local_ba8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
    testing::Message::~Message(&local_ba8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b30);
  protobuf::operator-(&local_c30,(Duration *)local_af8);
  operator/(&local_c08,&local_c30,0x4979cb9e00);
  TimeUtil::ToString_abi_cxx11_(&local_be0,(TimeUtil *)&local_c08,duration_17);
  testing::internal::EqHelper::
  Compare<char[14],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_bc0,"\"-0.999999999s\"",
             "TimeUtil::ToString((-large) / int64_t{315576000000})",(char (*) [14])"-0.999999999s",
             &local_be0);
  std::__cxx11::string::~string((string *)&local_be0);
  Duration::~Duration(&local_c08);
  Duration::~Duration(&local_c30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bc0);
  if (!bVar1) {
    testing::Message::Message(&local_c38);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_bc0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x11e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,&local_c38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
    testing::Message::~Message(&local_c38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_bc0);
  Duration::Duration(&local_cc0,(Duration *)local_af8);
  operator/(&local_c98,&local_cc0,-0x4979cb9e00);
  TimeUtil::ToString_abi_cxx11_(&local_c70,(TimeUtil *)&local_c98,duration_18);
  testing::internal::EqHelper::
  Compare<char[14],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_c50,"\"-0.999999999s\"",
             "TimeUtil::ToString(large / (int64_t{-315576000000}))",(char (*) [14])"-0.999999999s",
             &local_c70);
  std::__cxx11::string::~string((string *)&local_c70);
  Duration::~Duration(&local_c98);
  Duration::~Duration(&local_cc0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c50);
  if (!bVar1) {
    testing::Message::Message(&local_cc8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c50);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&large2.field_0 + 0x10),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x120,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&large2.field_0 + 0x10),&local_cc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&large2.field_0 + 0x10));
    testing::Message::~Message(&local_cc8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c50);
  protobuf::operator+((Duration *)&gtest_ar_24.message_,(Duration *)local_af8,(Duration *)local_60);
  operator%(&local_d30,(Duration *)local_af8,(Duration *)&gtest_ar_24.message_);
  testing::internal::EqHelper::
  Compare<google::protobuf::Duration,_google::protobuf::Duration,_nullptr>
            ((EqHelper *)local_d08,"large","large % large2",(Duration *)local_af8,&local_d30);
  Duration::~Duration(&local_d30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d08);
  if (!bVar1) {
    testing::Message::Message(&local_d38);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d08);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_25.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x122,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_25.message_,&local_d38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_25.message_);
    testing::Message::~Message(&local_d38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d08);
  protobuf::operator-(&local_d78,(Duration *)local_af8);
  protobuf::operator-(&local_dc8,(Duration *)local_af8);
  operator%(&local_da0,&local_dc8,(Duration *)&gtest_ar_24.message_);
  testing::internal::EqHelper::
  Compare<google::protobuf::Duration,_google::protobuf::Duration,_nullptr>
            ((EqHelper *)local_d50,"-large","(-large) % large2",&local_d78,&local_da0);
  Duration::~Duration(&local_da0);
  Duration::~Duration(&local_dc8);
  Duration::~Duration(&local_d78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d50);
  if (!bVar1) {
    testing::Message::Message(&local_dd0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d50);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_26.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x123,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_26.message_,&local_dd0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_26.message_);
    testing::Message::~Message(&local_dd0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d50);
  protobuf::operator-(&local_e38,(Duration *)&gtest_ar_24.message_);
  operator%(&local_e10,(Duration *)local_af8,&local_e38);
  testing::internal::EqHelper::
  Compare<google::protobuf::Duration,_google::protobuf::Duration,_nullptr>
            ((EqHelper *)local_de8,"large","large % (-large2)",(Duration *)local_af8,&local_e10);
  Duration::~Duration(&local_e10);
  Duration::~Duration(&local_e38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_de8);
  if (!bVar1) {
    testing::Message::Message(&local_e40);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_de8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_27.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x124,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_27.message_,&local_e40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_27.message_);
    testing::Message::~Message(&local_e40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_de8);
  operator%(&local_e80,(Duration *)&gtest_ar_24.message_,(Duration *)local_af8);
  testing::internal::EqHelper::
  Compare<google::protobuf::Duration,_google::protobuf::Duration,_nullptr>
            ((EqHelper *)local_e58,"one_nano","large2 % large",(Duration *)local_60,&local_e80);
  Duration::~Duration(&local_e80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e58);
  if (!bVar1) {
    testing::Message::Message(&local_e88);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e58);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_28.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x125,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_28.message_,&local_e88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_28.message_);
    testing::Message::~Message(&local_e88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e58);
  protobuf::operator-(&local_ec8,(Duration *)local_60);
  protobuf::operator-(&local_f18,(Duration *)&gtest_ar_24.message_);
  operator%(&local_ef0,&local_f18,(Duration *)local_af8);
  testing::internal::EqHelper::
  Compare<google::protobuf::Duration,_google::protobuf::Duration,_nullptr>
            ((EqHelper *)local_ea0,"-one_nano","(-large2) % large",&local_ec8,&local_ef0);
  Duration::~Duration(&local_ef0);
  Duration::~Duration(&local_f18);
  Duration::~Duration(&local_ec8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ea0);
  if (!bVar1) {
    testing::Message::Message(&local_f20);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ea0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_29.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x126,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_29.message_,&local_f20);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29.message_);
    testing::Message::~Message(&local_f20);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ea0);
  protobuf::operator-(&local_f88,(Duration *)local_af8);
  operator%(&local_f60,(Duration *)&gtest_ar_24.message_,&local_f88);
  testing::internal::EqHelper::
  Compare<google::protobuf::Duration,_google::protobuf::Duration,_nullptr>
            ((EqHelper *)local_f38,"one_nano","large2 % (-large)",(Duration *)local_60,&local_f60);
  Duration::~Duration(&local_f60);
  Duration::~Duration(&local_f88);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f38);
  if (!bVar1) {
    testing::Message::Message(&local_f90);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f38);
    testing::internal::AssertHelper::AssertHelper
              (&local_f98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x127,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f98,&local_f90);
    testing::internal::AssertHelper::~AssertHelper(&local_f98);
    testing::Message::~Message(&local_f90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f38);
  TimeUtil::NanosecondsToDuration((Duration *)&gtest_ar_30.message_,-5);
  Duration::operator=((Duration *)&gtest_ar.message_,(Duration *)&gtest_ar_30.message_);
  Duration::~Duration((Duration *)&gtest_ar_30.message_);
  TimeUtil::NanosecondsToDuration(&local_ff8,-2);
  Duration::Duration(&local_1048,(Duration *)&gtest_ar.message_);
  operator/(&local_1020,&local_1048,2);
  testing::internal::EqHelper::
  Compare<google::protobuf::Duration,_google::protobuf::Duration,_nullptr>
            ((EqHelper *)local_fd0,"TimeUtil::NanosecondsToDuration(-2)","a / 2",&local_ff8,
             &local_1020);
  Duration::~Duration(&local_1020);
  Duration::~Duration(&local_1048);
  Duration::~Duration(&local_ff8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_fd0);
  if (!bVar1) {
    testing::Message::Message(&local_1050);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_fd0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_31.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x12d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_31.message_,&local_1050);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_31.message_);
    testing::Message::~Message(&local_1050);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_fd0);
  TimeUtil::NanosecondsToDuration(&local_1090,2);
  Duration::Duration(&local_10e0,(Duration *)&gtest_ar.message_);
  operator/(&local_10b8,&local_10e0,-2);
  testing::internal::EqHelper::
  Compare<google::protobuf::Duration,_google::protobuf::Duration,_nullptr>
            ((EqHelper *)local_1068,"TimeUtil::NanosecondsToDuration(2)","a / (-2)",&local_1090,
             &local_10b8);
  Duration::~Duration(&local_10b8);
  Duration::~Duration(&local_10e0);
  Duration::~Duration(&local_1090);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1068);
  if (!bVar1) {
    testing::Message::Message(&local_10e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1068);
    testing::internal::AssertHelper::AssertHelper
              (&local_10f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x12e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_10f0,&local_10e8);
    testing::internal::AssertHelper::~AssertHelper(&local_10f0);
    testing::Message::~Message(&local_10e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1068);
  TimeUtil::NanosecondsToDuration((Duration *)&gtest_ar_32.message_,2);
  Duration::operator=((Duration *)&gtest_ar_1.message_,(Duration *)&gtest_ar_32.message_);
  Duration::~Duration((Duration *)&gtest_ar_32.message_);
  local_112c = -2;
  local_1138 = operator/((Duration *)&gtest_ar.message_,(Duration *)&gtest_ar_1.message_);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_1128,"-2","a / b",&local_112c,&local_1138);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1128);
  if (!bVar1) {
    testing::Message::Message(&local_1140);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1128);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_33.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x130,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_33.message_,&local_1140);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_33.message_);
    testing::Message::~Message(&local_1140);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1128);
  TimeUtil::NanosecondsToDuration(&local_1180,-1);
  operator%(&local_11a8,(Duration *)&gtest_ar.message_,(Duration *)&gtest_ar_1.message_);
  testing::internal::EqHelper::
  Compare<google::protobuf::Duration,_google::protobuf::Duration,_nullptr>
            ((EqHelper *)local_1158,"TimeUtil::NanosecondsToDuration(-1)","a % b",&local_1180,
             &local_11a8);
  Duration::~Duration(&local_11a8);
  Duration::~Duration(&local_1180);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1158);
  if (!bVar1) {
    testing::Message::Message(&local_11b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1158);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_34.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x131,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_34.message_,&local_11b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_34.message_);
    testing::Message::~Message(&local_11b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1158);
  local_11cc = 2;
  protobuf::operator-(&local_1200,(Duration *)&gtest_ar_1.message_);
  local_11d8 = operator/((Duration *)&gtest_ar.message_,&local_1200);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_11c8,"2","a / (-b)",&local_11cc,&local_11d8);
  Duration::~Duration(&local_1200);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_11c8);
  if (!bVar1) {
    testing::Message::Message(&local_1208);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_11c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_35.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x132,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_35.message_,&local_1208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_35.message_);
    testing::Message::~Message(&local_1208);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_11c8);
  TimeUtil::NanosecondsToDuration(&local_1248,-1);
  protobuf::operator-(&local_1298,(Duration *)&gtest_ar_1.message_);
  operator%(&local_1270,(Duration *)&gtest_ar.message_,&local_1298);
  testing::internal::EqHelper::
  Compare<google::protobuf::Duration,_google::protobuf::Duration,_nullptr>
            ((EqHelper *)local_1220,"TimeUtil::NanosecondsToDuration(-1)","a % (-b)",&local_1248,
             &local_1270);
  Duration::~Duration(&local_1270);
  Duration::~Duration(&local_1298);
  Duration::~Duration(&local_1248);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1220);
  if (!bVar1) {
    testing::Message::Message(&local_12a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1220);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x133,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_12a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_12a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1220);
  local_12b9 = protobuf::operator<((Duration *)local_60,(Duration *)((long)&one_nano.field_0 + 0x10)
                                  );
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_12b8,&local_12b9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_12b8);
  if (!bVar1) {
    testing::Message::Message(&local_12c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_12b8,
               (AssertionResult *)"one_nano < one_second","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_12d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x136,pcVar2);
    testing::internal::AssertHelper::operator=(&local_12d0,&local_12c8);
    testing::internal::AssertHelper::~AssertHelper(&local_12d0);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_12c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_12b8);
  d1 = (Duration *)((long)&one_nano.field_0 + 0x10);
  bVar1 = protobuf::operator<(d1,d1);
  local_1301 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1300,&local_1301,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1300);
  if (!bVar1) {
    testing::Message::Message(&local_1310);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_1300,
               (AssertionResult *)"one_second < one_second","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x137,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1318,&local_1310);
    testing::internal::AssertHelper::~AssertHelper(&local_1318);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_1310);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1300);
  bVar1 = protobuf::operator<((Duration *)((long)&one_nano.field_0 + 0x10),(Duration *)local_60);
  local_1349 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1348,&local_1349,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1348);
  if (!bVar1) {
    testing::Message::Message(&local_1358);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_1348,
               (AssertionResult *)"one_second < one_nano","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1360,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x138,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1360,&local_1358);
    testing::internal::AssertHelper::~AssertHelper(&local_1360);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_1358);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1348);
  protobuf::operator-(&local_13c0,(Duration *)local_60);
  protobuf::operator-(&local_13e8,(Duration *)((long)&one_nano.field_0 + 0x10));
  bVar1 = protobuf::operator<(&local_13c0,&local_13e8);
  local_1391 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1390,&local_1391,(type *)0x0);
  Duration::~Duration(&local_13e8);
  Duration::~Duration(&local_13c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1390);
  if (!bVar1) {
    testing::Message::Message(&local_13f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_1390,
               (AssertionResult *)"-one_nano < -one_second","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_13f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x139,pcVar2);
    testing::internal::AssertHelper::operator=(&local_13f8,&local_13f0);
    testing::internal::AssertHelper::~AssertHelper(&local_13f8);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_13f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1390);
  protobuf::operator-(&local_1458,(Duration *)((long)&one_nano.field_0 + 0x10));
  protobuf::operator-(&local_1480,(Duration *)((long)&one_nano.field_0 + 0x10));
  bVar1 = protobuf::operator<(&local_1458,&local_1480);
  local_1429 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1428,&local_1429,(type *)0x0);
  Duration::~Duration(&local_1480);
  Duration::~Duration(&local_1458);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1428);
  if (!bVar1) {
    testing::Message::Message(&local_1488);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_1428,
               (AssertionResult *)"-one_second < -one_second","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1490,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x13a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1490,&local_1488);
    testing::internal::AssertHelper::~AssertHelper(&local_1490);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_1488);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1428);
  protobuf::operator-(&local_14f0,(Duration *)((long)&one_nano.field_0 + 0x10));
  protobuf::operator-(&local_1518,(Duration *)local_60);
  local_14c1 = protobuf::operator<(&local_14f0,&local_1518);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_14c0,&local_14c1,(type *)0x0);
  Duration::~Duration(&local_1518);
  Duration::~Duration(&local_14f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_14c0);
  if (!bVar1) {
    testing::Message::Message(&local_1520);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_14c0,
               (AssertionResult *)"-one_second < -one_nano","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1528,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x13b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1528,&local_1520);
    testing::internal::AssertHelper::~AssertHelper(&local_1528);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_1520);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_14c0);
  protobuf::operator-(&local_1588,(Duration *)local_60);
  local_1559 = protobuf::operator<(&local_1588,(Duration *)local_60);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1558,&local_1559,(type *)0x0);
  Duration::~Duration(&local_1588);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1558);
  if (!bVar1) {
    testing::Message::Message(&local_1590);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__7.message_,(internal *)local_1558,
               (AssertionResult *)"-one_nano < one_nano","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1598,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x13c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1598,&local_1590);
    testing::internal::AssertHelper::~AssertHelper(&local_1598);
    std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_1590);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1558);
  protobuf::operator-(&local_15f8,(Duration *)local_60);
  bVar1 = protobuf::operator<((Duration *)local_60,&local_15f8);
  local_15c9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_15c8,&local_15c9,(type *)0x0);
  Duration::~Duration(&local_15f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_15c8);
  if (!bVar1) {
    testing::Message::Message(&local_1600);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__8.message_,(internal *)local_15c8,
               (AssertionResult *)"one_nano < -one_nano","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1608,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x13d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1608,&local_1600);
    testing::internal::AssertHelper::~AssertHelper(&local_1608);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(&local_1600);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_15c8);
  bVar1 = operator>((Duration *)local_60,(Duration *)((long)&one_nano.field_0 + 0x10));
  local_1639 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1638,&local_1639,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1638);
  if (!bVar1) {
    testing::Message::Message(&local_1648);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__9.message_,(internal *)local_1638,
               (AssertionResult *)"one_nano > one_second","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1650,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x13f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1650,&local_1648);
    testing::internal::AssertHelper::~AssertHelper(&local_1650);
    std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
    testing::Message::~Message(&local_1648);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1638);
  bVar1 = operator>((Duration *)local_60,(Duration *)local_60);
  local_1681 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1680,&local_1681,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1680);
  if (!bVar1) {
    testing::Message::Message(&local_1690);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__10.message_,(internal *)local_1680,
               (AssertionResult *)"one_nano > one_nano","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1698,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x140,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1698,&local_1690);
    testing::internal::AssertHelper::~AssertHelper(&local_1698);
    std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
    testing::Message::~Message(&local_1690);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1680);
  local_16c9 = operator>((Duration *)((long)&one_nano.field_0 + 0x10),(Duration *)local_60);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_16c8,&local_16c9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_16c8);
  if (!bVar1) {
    testing::Message::Message(&local_16d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__11.message_,(internal *)local_16c8,
               (AssertionResult *)"one_second > one_nano","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_16e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x141,pcVar2);
    testing::internal::AssertHelper::operator=(&local_16e0,&local_16d8);
    testing::internal::AssertHelper::~AssertHelper(&local_16e0);
    std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
    testing::Message::~Message(&local_16d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_16c8);
  bVar1 = operator>=((Duration *)local_60,(Duration *)((long)&one_nano.field_0 + 0x10));
  local_1711 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1710,&local_1711,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1710);
  if (!bVar1) {
    testing::Message::Message(&local_1720);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__12.message_,(internal *)local_1710,
               (AssertionResult *)"one_nano >= one_second","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1728,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x143,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1728,&local_1720);
    testing::internal::AssertHelper::~AssertHelper(&local_1728);
    std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
    testing::Message::~Message(&local_1720);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1710);
  local_1759 = operator>=((Duration *)local_60,(Duration *)local_60);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1758,&local_1759,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1758);
  if (!bVar1) {
    testing::Message::Message(&local_1768);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__13.message_,(internal *)local_1758,
               (AssertionResult *)"one_nano >= one_nano","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1770,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x144,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1770,&local_1768);
    testing::internal::AssertHelper::~AssertHelper(&local_1770);
    std::__cxx11::string::~string((string *)&gtest_ar__13.message_);
    testing::Message::~Message(&local_1768);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1758);
  local_17a1 = operator>=((Duration *)((long)&one_nano.field_0 + 0x10),(Duration *)local_60);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_17a0,&local_17a1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_17a0);
  if (!bVar1) {
    testing::Message::Message(&local_17b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__14.message_,(internal *)local_17a0,
               (AssertionResult *)"one_second >= one_nano","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_17b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x145,pcVar2);
    testing::internal::AssertHelper::operator=(&local_17b8,&local_17b0);
    testing::internal::AssertHelper::~AssertHelper(&local_17b8);
    std::__cxx11::string::~string((string *)&gtest_ar__14.message_);
    testing::Message::~Message(&local_17b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_17a0);
  local_17e9 = operator<=((Duration *)local_60,(Duration *)((long)&one_nano.field_0 + 0x10));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_17e8,&local_17e9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_17e8);
  if (!bVar1) {
    testing::Message::Message(&local_17f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__15.message_,(internal *)local_17e8,
               (AssertionResult *)"one_nano <= one_second","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1800,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x147,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1800,&local_17f8);
    testing::internal::AssertHelper::~AssertHelper(&local_1800);
    std::__cxx11::string::~string((string *)&gtest_ar__15.message_);
    testing::Message::~Message(&local_17f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_17e8);
  local_1831 = operator<=((Duration *)local_60,(Duration *)local_60);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1830,&local_1831,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1830);
  if (!bVar1) {
    testing::Message::Message(&local_1840);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__16.message_,(internal *)local_1830,
               (AssertionResult *)"one_nano <= one_nano","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1848,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x148,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1848,&local_1840);
    testing::internal::AssertHelper::~AssertHelper(&local_1848);
    std::__cxx11::string::~string((string *)&gtest_ar__16.message_);
    testing::Message::~Message(&local_1840);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1830);
  bVar1 = operator<=((Duration *)((long)&one_nano.field_0 + 0x10),(Duration *)local_60);
  local_1879 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1878,&local_1879,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1878);
  if (!bVar1) {
    testing::Message::Message(&local_1888);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__17.message_,(internal *)local_1878,
               (AssertionResult *)"one_second <= one_nano","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1890,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x149,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1890,&local_1888);
    testing::internal::AssertHelper::~AssertHelper(&local_1890);
    std::__cxx11::string::~string((string *)&gtest_ar__17.message_);
    testing::Message::~Message(&local_1888);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1878);
  local_18c1 = protobuf::operator==((Duration *)local_60,(Duration *)local_60);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_18c0,&local_18c1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_18c0);
  if (!bVar1) {
    testing::Message::Message(&local_18d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__18.message_,(internal *)local_18c0,
               (AssertionResult *)"one_nano == one_nano","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_18d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x14b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_18d8,&local_18d0);
    testing::internal::AssertHelper::~AssertHelper(&local_18d8);
    std::__cxx11::string::~string((string *)&gtest_ar__18.message_);
    testing::Message::~Message(&local_18d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_18c0);
  bVar1 = protobuf::operator==((Duration *)local_60,(Duration *)((long)&one_nano.field_0 + 0x10));
  local_1909 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1908,&local_1909,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1908);
  if (!bVar1) {
    testing::Message::Message(&local_1918);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__19.message_,(internal *)local_1908,
               (AssertionResult *)"one_nano == one_second","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1920,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x14c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1920,&local_1918);
    testing::internal::AssertHelper::~AssertHelper(&local_1920);
    std::__cxx11::string::~string((string *)&gtest_ar__19.message_);
    testing::Message::~Message(&local_1918);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1908);
  bVar1 = protobuf::operator!=((Duration *)local_60,(Duration *)local_60);
  local_1951 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1950,&local_1951,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1950);
  if (!bVar1) {
    testing::Message::Message(&local_1960);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__20.message_,(internal *)local_1950,
               (AssertionResult *)"one_nano != one_nano","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1968,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x14e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1968,&local_1960);
    testing::internal::AssertHelper::~AssertHelper(&local_1968);
    std::__cxx11::string::~string((string *)&gtest_ar__20.message_);
    testing::Message::~Message(&local_1960);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1950);
  local_1999 = protobuf::operator!=
                         ((Duration *)local_60,(Duration *)((long)&one_nano.field_0 + 0x10));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1998,&local_1999,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1998);
  if (!bVar1) {
    testing::Message::Message(&local_19a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_19d0,(internal *)local_1998,(AssertionResult *)"one_nano != one_second",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_19b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x14f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_19b0,&local_19a8);
    testing::internal::AssertHelper::~AssertHelper(&local_19b0);
    std::__cxx11::string::~string((string *)&local_19d0);
    testing::Message::~Message(&local_19a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1998);
  Duration::~Duration((Duration *)&gtest_ar_24.message_);
  Duration::~Duration((Duration *)local_af8);
  Duration::~Duration((Duration *)&gtest_ar_1.message_);
  Duration::~Duration((Duration *)&gtest_ar.message_);
  Duration::~Duration((Duration *)local_60);
  Duration::~Duration((Duration *)((long)&one_nano.field_0 + 0x10));
  return;
}

Assistant:

TEST(TimeUtilTest, DurationOperators) {
  Duration one_second = TimeUtil::SecondsToDuration(1);
  Duration one_nano = TimeUtil::NanosecondsToDuration(1);

  // Test +/-
  Duration a = one_second;
  a += one_second;
  a -= one_nano;
  EXPECT_EQ("1.999999999s", TimeUtil::ToString(a));
  Duration b = -a;
  EXPECT_EQ("-1.999999999s", TimeUtil::ToString(b));
  EXPECT_EQ("3.999999998s", TimeUtil::ToString(a + a));
  EXPECT_EQ("0s", TimeUtil::ToString(a + b));
  EXPECT_EQ("0s", TimeUtil::ToString(b + a));
  EXPECT_EQ("-3.999999998s", TimeUtil::ToString(b + b));
  EXPECT_EQ("3.999999998s", TimeUtil::ToString(a - b));
  EXPECT_EQ("0s", TimeUtil::ToString(a - a));
  EXPECT_EQ("0s", TimeUtil::ToString(b - b));
  EXPECT_EQ("-3.999999998s", TimeUtil::ToString(b - a));

  // Test *
  EXPECT_EQ(a + a, a * 2);
  EXPECT_EQ(b + b, a * (-2));
  EXPECT_EQ(b + b, b * 2);
  EXPECT_EQ(a + a, b * (-2));
  EXPECT_EQ("0.999999999s", TimeUtil::ToString(a * 0.5));
  EXPECT_EQ("-0.999999999s", TimeUtil::ToString(b * 0.5));
  // Multiplication should not overflow if the result fits into the supported
  // range of Duration (intermediate result may be larger than int64).
  EXPECT_EQ("315575999684.424s", TimeUtil::ToString((one_second - one_nano) *
                                                    int64_t{315576000000}));
  EXPECT_EQ("-315575999684.424s", TimeUtil::ToString((one_nano - one_second) *
                                                     int64_t{315576000000}));
  EXPECT_EQ("-315575999684.424s", TimeUtil::ToString((one_second - one_nano) *
                                                     (int64_t{-315576000000})));

  // Test / and %
  EXPECT_EQ("0.999999999s", TimeUtil::ToString(a / 2));
  EXPECT_EQ("-0.999999999s", TimeUtil::ToString(b / 2));
  Duration large =
      TimeUtil::SecondsToDuration(int64_t{315576000000}) - one_nano;
  // We have to handle division with values beyond 64 bits.
  EXPECT_EQ("0.999999999s", TimeUtil::ToString(large / int64_t{315576000000}));
  EXPECT_EQ("-0.999999999s",
            TimeUtil::ToString((-large) / int64_t{315576000000}));
  EXPECT_EQ("-0.999999999s",
            TimeUtil::ToString(large / (int64_t{-315576000000})));
  Duration large2 = large + one_nano;
  EXPECT_EQ(large, large % large2);
  EXPECT_EQ(-large, (-large) % large2);
  EXPECT_EQ(large, large % (-large2));
  EXPECT_EQ(one_nano, large2 % large);
  EXPECT_EQ(-one_nano, (-large2) % large);
  EXPECT_EQ(one_nano, large2 % (-large));
  // Some corner cases about negative values.
  //
  // (-5) / 2 = -2, remainder = -1
  // (-5) / (-2) = 2, remainder = -1
  a = TimeUtil::NanosecondsToDuration(-5);
  EXPECT_EQ(TimeUtil::NanosecondsToDuration(-2), a / 2);
  EXPECT_EQ(TimeUtil::NanosecondsToDuration(2), a / (-2));
  b = TimeUtil::NanosecondsToDuration(2);
  EXPECT_EQ(-2, a / b);
  EXPECT_EQ(TimeUtil::NanosecondsToDuration(-1), a % b);
  EXPECT_EQ(2, a / (-b));
  EXPECT_EQ(TimeUtil::NanosecondsToDuration(-1), a % (-b));

  // Test relational operators.
  EXPECT_TRUE(one_nano < one_second);
  EXPECT_FALSE(one_second < one_second);
  EXPECT_FALSE(one_second < one_nano);
  EXPECT_FALSE(-one_nano < -one_second);
  EXPECT_FALSE(-one_second < -one_second);
  EXPECT_TRUE(-one_second < -one_nano);
  EXPECT_TRUE(-one_nano < one_nano);
  EXPECT_FALSE(one_nano < -one_nano);

  EXPECT_FALSE(one_nano > one_second);
  EXPECT_FALSE(one_nano > one_nano);
  EXPECT_TRUE(one_second > one_nano);

  EXPECT_FALSE(one_nano >= one_second);
  EXPECT_TRUE(one_nano >= one_nano);
  EXPECT_TRUE(one_second >= one_nano);

  EXPECT_TRUE(one_nano <= one_second);
  EXPECT_TRUE(one_nano <= one_nano);
  EXPECT_FALSE(one_second <= one_nano);

  EXPECT_TRUE(one_nano == one_nano);
  EXPECT_FALSE(one_nano == one_second);

  EXPECT_FALSE(one_nano != one_nano);
  EXPECT_TRUE(one_nano != one_second);
}